

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCIntersectArguments *pRVar12;
  RTCRayQueryContext *pRVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 (*pauVar25) [16];
  int iVar26;
  long lVar27;
  ulong uVar28;
  int *piVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  Scene *pSVar34;
  undefined4 uVar35;
  ulong unaff_R12;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  float fVar48;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  undefined1 auVar46 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar80;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar81;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar82;
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar89;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar90;
  float fVar101;
  float fVar103;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar105;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar91;
  undefined1 auVar97 [16];
  float fVar102;
  float fVar104;
  float fVar106;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar120 [16];
  float fVar131;
  undefined1 auVar121 [16];
  float fVar126;
  float fVar129;
  float fVar132;
  undefined1 auVar122 [16];
  float fVar127;
  float fVar130;
  float fVar133;
  undefined1 auVar123 [16];
  float fVar125;
  float fVar128;
  undefined1 auVar124 [64];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar141 [64];
  float fVar145;
  undefined1 auVar146 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar147 [64];
  float fVar151;
  float fVar152;
  undefined1 auVar153 [16];
  float fVar160;
  undefined1 auVar154 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar161;
  undefined1 auVar155 [64];
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar163 [64];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1291;
  ulong local_1290;
  ulong local_1288;
  ulong local_1280;
  undefined1 local_1278 [16];
  RayQueryContext *local_1268;
  int local_125c;
  undefined8 local_1258;
  float fStack_1250;
  float fStack_124c;
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [16];
  ulong local_1228;
  RTCFilterFunctionNArguments local_1220;
  ulong local_11f0;
  ulong local_11e8;
  undefined1 (*local_11e0) [16];
  long local_11d8;
  ulong local_11d0;
  float local_11c8;
  undefined4 local_11c4;
  undefined4 local_11c0;
  undefined4 local_11bc;
  undefined4 local_11b8;
  undefined4 local_11b4;
  uint local_11b0;
  uint local_11ac;
  uint local_11a8;
  undefined1 local_1198 [16];
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 *local_1138;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      auVar49 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar100 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar83._8_4_ = 0x7fffffff;
      auVar83._0_8_ = 0x7fffffff7fffffff;
      auVar83._12_4_ = 0x7fffffff;
      auVar83 = vandps_avx((undefined1  [16])aVar2,auVar83);
      auVar99._8_4_ = 0x219392ef;
      auVar99._0_8_ = 0x219392ef219392ef;
      auVar99._12_4_ = 0x219392ef;
      auVar83 = vcmpps_avx(auVar83,auVar99,1);
      auVar92._8_4_ = 0x3f800000;
      auVar92._0_8_ = &DAT_3f8000003f800000;
      auVar92._12_4_ = 0x3f800000;
      auVar99 = vdivps_avx(auVar92,(undefined1  [16])aVar2);
      auVar93._8_4_ = 0x5d5e0b6b;
      auVar93._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar93._12_4_ = 0x5d5e0b6b;
      auVar83 = vblendvps_avx(auVar99,auVar93,auVar83);
      local_11e0 = (undefined1 (*) [16])local_f68;
      auVar84._0_4_ = auVar83._0_4_ * 0.99999964;
      auVar84._4_4_ = auVar83._4_4_ * 0.99999964;
      auVar84._8_4_ = auVar83._8_4_ * 0.99999964;
      auVar84._12_4_ = auVar83._12_4_ * 0.99999964;
      auVar69._0_4_ = auVar83._0_4_ * 1.0000004;
      auVar69._4_4_ = auVar83._4_4_ * 1.0000004;
      auVar69._8_4_ = auVar83._8_4_ * 1.0000004;
      auVar69._12_4_ = auVar83._12_4_ * 1.0000004;
      uVar35 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_1038._4_4_ = uVar35;
      local_1038._0_4_ = uVar35;
      local_1038._8_4_ = uVar35;
      local_1038._12_4_ = uVar35;
      auVar116 = ZEXT1664(local_1038);
      uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_1048._4_4_ = uVar35;
      local_1048._0_4_ = uVar35;
      local_1048._8_4_ = uVar35;
      local_1048._12_4_ = uVar35;
      auVar124 = ZEXT1664(local_1048);
      uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_1058._4_4_ = uVar35;
      local_1058._0_4_ = uVar35;
      local_1058._8_4_ = uVar35;
      local_1058._12_4_ = uVar35;
      auVar137 = ZEXT1664(local_1058);
      local_1068 = vshufps_avx(auVar84,auVar84,0);
      auVar138 = ZEXT1664(local_1068);
      auVar83 = vmovshdup_avx(auVar84);
      local_1078 = vshufps_avx(auVar84,auVar84,0x55);
      auVar139 = ZEXT1664(local_1078);
      auVar99 = vshufpd_avx(auVar84,auVar84,1);
      local_1088 = vshufps_avx(auVar84,auVar84,0xaa);
      auVar141 = ZEXT1664(local_1088);
      local_1098 = vshufps_avx(auVar69,auVar69,0);
      auVar147 = ZEXT1664(local_1098);
      local_11e8 = (ulong)(auVar84._0_4_ < 0.0) << 4;
      local_10a8 = vshufps_avx(auVar69,auVar69,0x55);
      auVar155 = ZEXT1664(local_10a8);
      local_10b8 = vshufps_avx(auVar69,auVar69,0xaa);
      auVar163 = ZEXT1664(local_10b8);
      local_11f0 = (ulong)(auVar83._0_4_ < 0.0) << 4 | 0x20;
      local_1280 = (ulong)(auVar99._0_4_ < 0.0) << 4 | 0x40;
      local_1288 = local_11e8 ^ 0x10;
      uVar33 = local_11f0 ^ 0x10;
      local_11d0 = local_1280 ^ 0x10;
      local_1198 = vshufps_avx(auVar49,auVar49,0);
      auVar110 = ZEXT1664(local_1198);
      auVar83 = vshufps_avx(auVar100,auVar100,0);
      auVar46 = ZEXT1664(auVar83);
      local_1188 = mm_lookupmask_ps._240_8_;
      uStack_1180 = mm_lookupmask_ps._248_8_;
      uVar28 = local_11e8;
      uVar30 = local_1280;
      uVar31 = local_1288;
      uVar38 = local_11f0;
      local_1290 = uVar33;
      local_1268 = context;
      do {
        do {
          do {
            if (local_11e0 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar25 = local_11e0 + -1;
            local_11e0 = local_11e0 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar25 + 8));
          uVar37 = *(ulong *)*local_11e0;
          do {
            if ((uVar37 & 8) == 0) {
              auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar28),auVar116._0_16_);
              auVar49._0_4_ = auVar138._0_4_ * auVar83._0_4_;
              auVar49._4_4_ = auVar138._4_4_ * auVar83._4_4_;
              auVar49._8_4_ = auVar138._8_4_ * auVar83._8_4_;
              auVar49._12_4_ = auVar138._12_4_ * auVar83._12_4_;
              auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar38),auVar124._0_16_);
              auVar100._0_4_ = auVar139._0_4_ * auVar83._0_4_;
              auVar100._4_4_ = auVar139._4_4_ * auVar83._4_4_;
              auVar100._8_4_ = auVar139._8_4_ * auVar83._8_4_;
              auVar100._12_4_ = auVar139._12_4_ * auVar83._12_4_;
              auVar83 = vmaxps_avx(auVar49,auVar100);
              auVar99 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar30),auVar137._0_16_);
              auVar58._0_4_ = auVar141._0_4_ * auVar99._0_4_;
              auVar58._4_4_ = auVar141._4_4_ * auVar99._4_4_;
              auVar58._8_4_ = auVar141._8_4_ * auVar99._8_4_;
              auVar58._12_4_ = auVar141._12_4_ * auVar99._12_4_;
              auVar99 = vmaxps_avx(auVar58,auVar110._0_16_);
              local_1168 = vmaxps_avx(auVar83,auVar99);
              auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar31),auVar116._0_16_);
              auVar59._0_4_ = auVar147._0_4_ * auVar83._0_4_;
              auVar59._4_4_ = auVar147._4_4_ * auVar83._4_4_;
              auVar59._8_4_ = auVar147._8_4_ * auVar83._8_4_;
              auVar59._12_4_ = auVar147._12_4_ * auVar83._12_4_;
              auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar33),auVar124._0_16_);
              auVar70._0_4_ = auVar155._0_4_ * auVar83._0_4_;
              auVar70._4_4_ = auVar155._4_4_ * auVar83._4_4_;
              auVar70._8_4_ = auVar155._8_4_ * auVar83._8_4_;
              auVar70._12_4_ = auVar155._12_4_ * auVar83._12_4_;
              auVar83 = vminps_avx(auVar59,auVar70);
              auVar99 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + local_11d0),
                                   auVar137._0_16_);
              auVar71._0_4_ = auVar163._0_4_ * auVar99._0_4_;
              auVar71._4_4_ = auVar163._4_4_ * auVar99._4_4_;
              auVar71._8_4_ = auVar163._8_4_ * auVar99._8_4_;
              auVar71._12_4_ = auVar163._12_4_ * auVar99._12_4_;
              auVar99 = vminps_avx(auVar71,auVar46._0_16_);
              auVar83 = vminps_avx(auVar83,auVar99);
              auVar83 = vcmpps_avx(local_1168,auVar83,2);
              uVar35 = vmovmskps_avx(auVar83);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar35);
            }
            if ((uVar37 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar26 = 4;
              }
              else {
                uVar36 = uVar37 & 0xfffffffffffffff0;
                lVar39 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                  }
                }
                iVar26 = 0;
                uVar37 = *(ulong *)(uVar36 + lVar39 * 8);
                uVar32 = unaff_R12 - 1 & unaff_R12;
                if (uVar32 != 0) {
                  uVar4 = *(uint *)(local_1168 + lVar39 * 4);
                  lVar39 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                    }
                  }
                  uVar5 = *(ulong *)(uVar36 + lVar39 * 8);
                  uVar3 = *(uint *)(local_1168 + lVar39 * 4);
                  uVar32 = uVar32 - 1 & uVar32;
                  uVar30 = local_1280;
                  uVar31 = local_1288;
                  uVar33 = local_1290;
                  if (uVar32 == 0) {
                    if (uVar4 < uVar3) {
                      *(ulong *)*local_11e0 = uVar5;
                      *(uint *)(*local_11e0 + 8) = uVar3;
                      local_11e0 = local_11e0 + 1;
                    }
                    else {
                      *(ulong *)*local_11e0 = uVar37;
                      *(uint *)(*local_11e0 + 8) = uVar4;
                      local_11e0 = local_11e0 + 1;
                      uVar37 = uVar5;
                    }
                  }
                  else {
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = uVar37;
                    auVar83 = vpunpcklqdq_avx(auVar50,ZEXT416(uVar4));
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = uVar5;
                    auVar99 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar3));
                    lVar39 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                      }
                    }
                    auVar72._8_8_ = 0;
                    auVar72._0_8_ = *(ulong *)(uVar36 + lVar39 * 8);
                    auVar100 = vpunpcklqdq_avx(auVar72,ZEXT416(*(uint *)(local_1168 + lVar39 * 4)));
                    auVar49 = vpcmpgtd_avx(auVar99,auVar83);
                    uVar32 = uVar32 - 1 & uVar32;
                    if (uVar32 == 0) {
                      auVar69 = vpshufd_avx(auVar49,0xaa);
                      auVar49 = vblendvps_avx(auVar99,auVar83,auVar69);
                      auVar83 = vblendvps_avx(auVar83,auVar99,auVar69);
                      auVar99 = vpcmpgtd_avx(auVar100,auVar49);
                      auVar69 = vpshufd_avx(auVar99,0xaa);
                      auVar99 = vblendvps_avx(auVar100,auVar49,auVar69);
                      auVar49 = vblendvps_avx(auVar49,auVar100,auVar69);
                      auVar100 = vpcmpgtd_avx(auVar49,auVar83);
                      auVar69 = vpshufd_avx(auVar100,0xaa);
                      auVar100 = vblendvps_avx(auVar49,auVar83,auVar69);
                      auVar83 = vblendvps_avx(auVar83,auVar49,auVar69);
                      *local_11e0 = auVar83;
                      local_11e0[1] = auVar100;
                      uVar37 = auVar99._0_8_;
                      local_11e0 = local_11e0 + 2;
                    }
                    else {
                      lVar39 = 0;
                      if (uVar32 != 0) {
                        for (; (uVar32 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                        }
                      }
                      auVar94._8_8_ = 0;
                      auVar94._0_8_ = *(ulong *)(uVar36 + lVar39 * 8);
                      auVar84 = vpunpcklqdq_avx(auVar94,ZEXT416(*(uint *)(local_1168 + lVar39 * 4)))
                      ;
                      auVar69 = vpshufd_avx(auVar49,0xaa);
                      auVar49 = vblendvps_avx(auVar99,auVar83,auVar69);
                      auVar83 = vblendvps_avx(auVar83,auVar99,auVar69);
                      auVar99 = vpcmpgtd_avx(auVar84,auVar100);
                      auVar69 = vpshufd_avx(auVar99,0xaa);
                      auVar99 = vblendvps_avx(auVar84,auVar100,auVar69);
                      auVar100 = vblendvps_avx(auVar100,auVar84,auVar69);
                      auVar69 = vpcmpgtd_avx(auVar100,auVar83);
                      auVar84 = vpshufd_avx(auVar69,0xaa);
                      auVar69 = vblendvps_avx(auVar100,auVar83,auVar84);
                      auVar83 = vblendvps_avx(auVar83,auVar100,auVar84);
                      auVar100 = vpcmpgtd_avx(auVar99,auVar49);
                      auVar84 = vpshufd_avx(auVar100,0xaa);
                      auVar100 = vblendvps_avx(auVar99,auVar49,auVar84);
                      auVar99 = vblendvps_avx(auVar49,auVar99,auVar84);
                      auVar49 = vpcmpgtd_avx(auVar69,auVar99);
                      auVar84 = vpshufd_avx(auVar49,0xaa);
                      auVar49 = vblendvps_avx(auVar69,auVar99,auVar84);
                      auVar99 = vblendvps_avx(auVar99,auVar69,auVar84);
                      *local_11e0 = auVar83;
                      local_11e0[1] = auVar99;
                      local_11e0[2] = auVar49;
                      auVar110 = ZEXT1664(local_1198);
                      uVar37 = auVar100._0_8_;
                      local_11e0 = local_11e0 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar26 = 6;
            }
          } while (iVar26 == 0);
        } while (iVar26 != 6);
        local_11d8 = (ulong)((uint)uVar37 & 0xf) - 8;
        if (local_11d8 != 0) {
          uVar37 = uVar37 & 0xfffffffffffffff0;
          lVar39 = 0;
          local_1228 = unaff_R12;
          do {
            lVar27 = lVar39 * 0x50;
            pSVar34 = context->scene;
            ppfVar6 = (pSVar34->vertices).items;
            pfVar7 = ppfVar6[*(uint *)(uVar37 + 0x30 + lVar27)];
            pfVar8 = ppfVar6[*(uint *)(uVar37 + 0x34 + lVar27)];
            pfVar9 = ppfVar6[*(uint *)(uVar37 + 0x38 + lVar27)];
            pfVar10 = ppfVar6[*(uint *)(uVar37 + 0x3c + lVar27)];
            auVar49 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar37 + lVar27)),
                                    *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar37 + 8 + lVar27)))
            ;
            auVar83 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar37 + lVar27)),
                                    *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar37 + 8 + lVar27)))
            ;
            auVar100 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar37 + 4 + lVar27))
                                     ,*(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar37 + 0xc + lVar27)));
            auVar99 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar37 + 4 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar37 + 0xc + lVar27)));
            auVar84 = vunpcklps_avx(auVar83,auVar99);
            auVar92 = vunpcklps_avx(auVar49,auVar100);
            auVar83 = vunpckhps_avx(auVar49,auVar100);
            auVar100 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar37 + 0x10 + lVar27)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar37 + 0x18 + lVar27)));
            auVar99 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar37 + 0x10 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar37 + 0x18 + lVar27)));
            auVar69 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar37 + 0x14 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar37 + 0x1c + lVar27)));
            auVar49 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar37 + 0x14 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar37 + 0x1c + lVar27)));
            auVar93 = vunpcklps_avx(auVar99,auVar49);
            auVar58 = vunpcklps_avx(auVar100,auVar69);
            auVar99 = vunpckhps_avx(auVar100,auVar69);
            auVar69 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar37 + 0x20 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar37 + 0x28 + lVar27)));
            auVar49 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar37 + 0x20 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar37 + 0x28 + lVar27)));
            auVar59 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar37 + 0x24 + lVar27)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar37 + 0x2c + lVar27)));
            auVar100 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar37 + 0x24 + lVar27)),
                                     *(undefined1 (*) [16])
                                      (pfVar10 + *(uint *)(uVar37 + 0x2c + lVar27)));
            auVar70 = vunpcklps_avx(auVar49,auVar100);
            auVar100 = vunpcklps_avx(auVar69,auVar59);
            auVar69 = vunpckhps_avx(auVar69,auVar59);
            puVar1 = (undefined8 *)(uVar37 + 0x30 + lVar27);
            local_f88 = *puVar1;
            uStack_f80 = puVar1[1];
            puVar1 = (undefined8 *)(uVar37 + 0x40 + lVar27);
            local_1178 = *puVar1;
            uStack_1170 = puVar1[1];
            uVar35 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar134._4_4_ = uVar35;
            auVar134._0_4_ = uVar35;
            auVar134._8_4_ = uVar35;
            auVar134._12_4_ = uVar35;
            uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar146._4_4_ = uVar35;
            auVar146._0_4_ = uVar35;
            auVar146._8_4_ = uVar35;
            auVar146._12_4_ = uVar35;
            uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar153._4_4_ = uVar35;
            auVar153._0_4_ = uVar35;
            auVar153._8_4_ = uVar35;
            auVar153._12_4_ = uVar35;
            local_f98 = vsubps_avx(auVar92,auVar134);
            local_fa8 = vsubps_avx(auVar83,auVar146);
            local_fb8 = vsubps_avx(auVar84,auVar153);
            auVar83 = vsubps_avx(auVar58,auVar134);
            auVar99 = vsubps_avx(auVar99,auVar146);
            auVar49 = vsubps_avx(auVar93,auVar153);
            auVar100 = vsubps_avx(auVar100,auVar134);
            auVar69 = vsubps_avx(auVar69,auVar146);
            auVar84 = vsubps_avx(auVar70,auVar153);
            local_fc8 = vsubps_avx(auVar100,local_f98);
            local_fd8 = vsubps_avx(auVar69,local_fa8);
            local_fe8 = vsubps_avx(auVar84,local_fb8);
            fVar14 = local_fa8._0_4_;
            fVar82 = auVar69._0_4_ + fVar14;
            fVar102 = local_fa8._4_4_;
            fVar87 = auVar69._4_4_ + fVar102;
            fVar17 = local_fa8._8_4_;
            fVar88 = auVar69._8_4_ + fVar17;
            fVar20 = local_fa8._12_4_;
            fVar89 = auVar69._12_4_ + fVar20;
            fVar15 = local_fb8._0_4_;
            fVar90 = auVar84._0_4_ + fVar15;
            fVar104 = local_fb8._4_4_;
            fVar101 = auVar84._4_4_ + fVar104;
            fVar18 = local_fb8._8_4_;
            fVar103 = auVar84._8_4_ + fVar18;
            fVar21 = local_fb8._12_4_;
            fVar105 = auVar84._12_4_ + fVar21;
            fVar68 = local_fe8._0_4_;
            auVar120._0_4_ = fVar68 * fVar82;
            fVar80 = local_fe8._4_4_;
            auVar120._4_4_ = fVar80 * fVar87;
            fVar47 = local_fe8._8_4_;
            auVar120._8_4_ = fVar47 * fVar88;
            fVar48 = local_fe8._12_4_;
            auVar120._12_4_ = fVar48 * fVar89;
            fVar162 = local_fd8._0_4_;
            auVar135._0_4_ = fVar162 * fVar90;
            fVar164 = local_fd8._4_4_;
            auVar135._4_4_ = fVar164 * fVar101;
            fVar165 = local_fd8._8_4_;
            auVar135._8_4_ = fVar165 * fVar103;
            fVar166 = local_fd8._12_4_;
            auVar135._12_4_ = fVar166 * fVar105;
            auVar92 = vsubps_avx(auVar135,auVar120);
            fVar16 = local_f98._0_4_;
            fVar117 = auVar100._0_4_ + fVar16;
            fVar106 = local_f98._4_4_;
            fVar125 = auVar100._4_4_ + fVar106;
            fVar19 = local_f98._8_4_;
            fVar128 = auVar100._8_4_ + fVar19;
            fVar22 = local_f98._12_4_;
            fVar131 = auVar100._12_4_ + fVar22;
            fVar151 = local_fc8._0_4_;
            auVar95._0_4_ = fVar151 * fVar90;
            fVar156 = local_fc8._4_4_;
            auVar95._4_4_ = fVar156 * fVar101;
            fVar158 = local_fc8._8_4_;
            auVar95._8_4_ = fVar158 * fVar103;
            fVar160 = local_fc8._12_4_;
            auVar95._12_4_ = fVar160 * fVar105;
            auVar136._0_4_ = fVar117 * fVar68;
            auVar136._4_4_ = fVar125 * fVar80;
            auVar136._8_4_ = fVar128 * fVar47;
            auVar136._12_4_ = fVar131 * fVar48;
            auVar93 = vsubps_avx(auVar136,auVar95);
            auVar121._0_4_ = fVar162 * fVar117;
            auVar121._4_4_ = fVar164 * fVar125;
            auVar121._8_4_ = fVar165 * fVar128;
            auVar121._12_4_ = fVar166 * fVar131;
            auVar85._0_4_ = fVar151 * fVar82;
            auVar85._4_4_ = fVar156 * fVar87;
            auVar85._8_4_ = fVar158 * fVar88;
            auVar85._12_4_ = fVar160 * fVar89;
            auVar58 = vsubps_avx(auVar85,auVar121);
            local_1258._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar82 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_1244 = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_1018._0_4_ =
                 fStack_1244 * auVar92._0_4_ +
                 fVar82 * auVar93._0_4_ + local_1258._4_4_ * auVar58._0_4_;
            local_1018._4_4_ =
                 fStack_1244 * auVar92._4_4_ +
                 fVar82 * auVar93._4_4_ + local_1258._4_4_ * auVar58._4_4_;
            local_1018._8_4_ =
                 fStack_1244 * auVar92._8_4_ +
                 fVar82 * auVar93._8_4_ + local_1258._4_4_ * auVar58._8_4_;
            local_1018._12_4_ =
                 fStack_1244 * auVar92._12_4_ +
                 fVar82 * auVar93._12_4_ + local_1258._4_4_ * auVar58._12_4_;
            local_ff8 = vsubps_avx(local_fa8,auVar99);
            local_1008 = vsubps_avx(local_fb8,auVar49);
            fVar87 = fVar14 + auVar99._0_4_;
            fVar88 = fVar102 + auVar99._4_4_;
            fVar89 = fVar17 + auVar99._8_4_;
            fVar90 = fVar20 + auVar99._12_4_;
            fVar101 = auVar49._0_4_ + fVar15;
            fVar103 = auVar49._4_4_ + fVar104;
            fVar105 = auVar49._8_4_ + fVar18;
            fVar117 = auVar49._12_4_ + fVar21;
            fVar118 = local_1008._0_4_;
            auVar154._0_4_ = fVar118 * fVar87;
            fVar126 = local_1008._4_4_;
            auVar154._4_4_ = fVar126 * fVar88;
            fVar129 = local_1008._8_4_;
            auVar154._8_4_ = fVar129 * fVar89;
            fVar132 = local_1008._12_4_;
            auVar154._12_4_ = fVar132 * fVar90;
            fVar145 = local_ff8._0_4_;
            auVar73._0_4_ = fVar145 * fVar101;
            fVar148 = local_ff8._4_4_;
            auVar73._4_4_ = fVar148 * fVar103;
            fVar149 = local_ff8._8_4_;
            auVar73._8_4_ = fVar149 * fVar105;
            fVar150 = local_ff8._12_4_;
            auVar73._12_4_ = fVar150 * fVar117;
            auVar92 = vsubps_avx(auVar73,auVar154);
            auVar93 = vsubps_avx(local_f98,auVar83);
            fVar152 = auVar93._0_4_;
            auVar96._0_4_ = fVar152 * fVar101;
            fVar157 = auVar93._4_4_;
            auVar96._4_4_ = fVar157 * fVar103;
            fVar159 = auVar93._8_4_;
            auVar96._8_4_ = fVar159 * fVar105;
            fVar161 = auVar93._12_4_;
            auVar96._12_4_ = fVar161 * fVar117;
            fVar101 = auVar83._0_4_ + fVar16;
            fVar103 = auVar83._4_4_ + fVar106;
            fVar105 = auVar83._8_4_ + fVar19;
            fVar117 = auVar83._12_4_ + fVar22;
            auVar122._0_4_ = fVar118 * fVar101;
            auVar122._4_4_ = fVar126 * fVar103;
            auVar122._8_4_ = fVar129 * fVar105;
            auVar122._12_4_ = fVar132 * fVar117;
            auVar93 = vsubps_avx(auVar122,auVar96);
            auVar111._0_4_ = fVar145 * fVar101;
            auVar111._4_4_ = fVar148 * fVar103;
            auVar111._8_4_ = fVar149 * fVar105;
            auVar111._12_4_ = fVar150 * fVar117;
            auVar86._0_4_ = fVar152 * fVar87;
            auVar86._4_4_ = fVar157 * fVar88;
            auVar86._8_4_ = fVar159 * fVar89;
            auVar86._12_4_ = fVar161 * fVar90;
            auVar58 = vsubps_avx(auVar86,auVar111);
            local_1158._0_4_ =
                 fStack_1244 * auVar92._0_4_ +
                 fVar82 * auVar93._0_4_ + local_1258._4_4_ * auVar58._0_4_;
            local_1158._4_4_ =
                 fStack_1244 * auVar92._4_4_ +
                 fVar82 * auVar93._4_4_ + local_1258._4_4_ * auVar58._4_4_;
            local_1158._8_4_ =
                 fStack_1244 * auVar92._8_4_ +
                 fVar82 * auVar93._8_4_ + local_1258._4_4_ * auVar58._8_4_;
            local_1158._12_4_ =
                 fStack_1244 * auVar92._12_4_ +
                 fVar82 * auVar93._12_4_ + local_1258._4_4_ * auVar58._12_4_;
            auVar92 = vsubps_avx(auVar83,auVar100);
            fVar125 = auVar83._0_4_ + auVar100._0_4_;
            fVar128 = auVar83._4_4_ + auVar100._4_4_;
            fVar131 = auVar83._8_4_ + auVar100._8_4_;
            fVar81 = auVar83._12_4_ + auVar100._12_4_;
            auVar83 = vsubps_avx(auVar99,auVar69);
            fVar101 = auVar69._0_4_ + auVar99._0_4_;
            fVar103 = auVar69._4_4_ + auVar99._4_4_;
            fVar105 = auVar69._8_4_ + auVar99._8_4_;
            fVar117 = auVar69._12_4_ + auVar99._12_4_;
            auVar99 = vsubps_avx(auVar49,auVar84);
            fVar87 = auVar49._0_4_ + auVar84._0_4_;
            fVar88 = auVar49._4_4_ + auVar84._4_4_;
            fVar89 = auVar49._8_4_ + auVar84._8_4_;
            fVar90 = auVar49._12_4_ + auVar84._12_4_;
            fVar119 = auVar99._0_4_;
            auVar51._0_4_ = fVar119 * fVar101;
            fVar127 = auVar99._4_4_;
            auVar51._4_4_ = fVar127 * fVar103;
            fVar130 = auVar99._8_4_;
            auVar51._8_4_ = fVar130 * fVar105;
            fVar133 = auVar99._12_4_;
            auVar51._12_4_ = fVar133 * fVar117;
            fVar140 = auVar83._0_4_;
            auVar112._0_4_ = fVar140 * fVar87;
            fVar142 = auVar83._4_4_;
            auVar112._4_4_ = fVar142 * fVar88;
            fVar143 = auVar83._8_4_;
            auVar112._8_4_ = fVar143 * fVar89;
            fVar144 = auVar83._12_4_;
            auVar112._12_4_ = fVar144 * fVar90;
            auVar83 = vsubps_avx(auVar112,auVar51);
            fVar91 = auVar92._0_4_;
            auVar40._0_4_ = fVar91 * fVar87;
            fVar87 = auVar92._4_4_;
            auVar40._4_4_ = fVar87 * fVar88;
            fVar88 = auVar92._8_4_;
            auVar40._8_4_ = fVar88 * fVar89;
            fVar89 = auVar92._12_4_;
            auVar40._12_4_ = fVar89 * fVar90;
            auVar113._0_4_ = fVar119 * fVar125;
            auVar113._4_4_ = fVar127 * fVar128;
            auVar113._8_4_ = fVar130 * fVar131;
            auVar113._12_4_ = fVar133 * fVar81;
            auVar99 = vsubps_avx(auVar113,auVar40);
            auVar74._0_4_ = fVar140 * fVar125;
            auVar74._4_4_ = fVar142 * fVar128;
            auVar74._8_4_ = fVar143 * fVar131;
            auVar74._12_4_ = fVar144 * fVar81;
            auVar61._0_4_ = fVar91 * fVar101;
            auVar61._4_4_ = fVar87 * fVar103;
            auVar61._8_4_ = fVar88 * fVar105;
            auVar61._12_4_ = fVar89 * fVar117;
            auVar49 = vsubps_avx(auVar61,auVar74);
            local_1258._0_4_ = local_1258._4_4_;
            fStack_1250 = local_1258._4_4_;
            fStack_124c = local_1258._4_4_;
            local_1248 = fStack_1244;
            fStack_1240 = fStack_1244;
            fStack_123c = fStack_1244;
            auVar41._0_4_ =
                 fStack_1244 * auVar83._0_4_ +
                 fVar82 * auVar99._0_4_ + local_1258._4_4_ * auVar49._0_4_;
            auVar41._4_4_ =
                 fStack_1244 * auVar83._4_4_ +
                 fVar82 * auVar99._4_4_ + local_1258._4_4_ * auVar49._4_4_;
            auVar41._8_4_ =
                 fStack_1244 * auVar83._8_4_ +
                 fVar82 * auVar99._8_4_ + local_1258._4_4_ * auVar49._8_4_;
            auVar41._12_4_ =
                 fStack_1244 * auVar83._12_4_ +
                 fVar82 * auVar99._12_4_ + local_1258._4_4_ * auVar49._12_4_;
            local_1148._0_4_ = auVar41._0_4_ + local_1018._0_4_ + local_1158._0_4_;
            local_1148._4_4_ = auVar41._4_4_ + local_1018._4_4_ + local_1158._4_4_;
            local_1148._8_4_ = auVar41._8_4_ + local_1018._8_4_ + local_1158._8_4_;
            local_1148._12_4_ = auVar41._12_4_ + local_1018._12_4_ + local_1158._12_4_;
            auVar83 = vminps_avx(local_1018,local_1158);
            auVar99 = vminps_avx(auVar83,auVar41);
            auVar62._8_4_ = 0x7fffffff;
            auVar62._0_8_ = 0x7fffffff7fffffff;
            auVar62._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx(local_1148,auVar62);
            auVar63._0_4_ = auVar83._0_4_ * 1.1920929e-07;
            auVar63._4_4_ = auVar83._4_4_ * 1.1920929e-07;
            auVar63._8_4_ = auVar83._8_4_ * 1.1920929e-07;
            auVar63._12_4_ = auVar83._12_4_ * 1.1920929e-07;
            uVar28 = CONCAT44(auVar63._4_4_,auVar63._0_4_);
            auVar75._0_8_ = uVar28 ^ 0x8000000080000000;
            auVar75._8_4_ = -auVar63._8_4_;
            auVar75._12_4_ = -auVar63._12_4_;
            auVar99 = vcmpps_avx(auVar99,auVar75,5);
            auVar49 = vmaxps_avx(local_1018,local_1158);
            auVar49 = vmaxps_avx(auVar49,auVar41);
            auVar49 = vcmpps_avx(auVar49,auVar63,2);
            local_1028 = vorps_avx(auVar99,auVar49);
            local_1291 = 0;
            local_1138 = &local_1291;
            auVar23._8_8_ = uStack_1180;
            auVar23._0_8_ = local_1188;
            auVar23 = auVar23 & local_1028;
            if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar23[0xf] < '\0') {
              auVar42._0_4_ = fVar145 * fVar68;
              auVar42._4_4_ = fVar148 * fVar80;
              auVar42._8_4_ = fVar149 * fVar47;
              auVar42._12_4_ = fVar150 * fVar48;
              auVar52._0_4_ = fVar162 * fVar118;
              auVar52._4_4_ = fVar164 * fVar126;
              auVar52._8_4_ = fVar165 * fVar129;
              auVar52._12_4_ = fVar166 * fVar132;
              auVar100 = vsubps_avx(auVar52,auVar42);
              auVar64._0_4_ = fVar118 * fVar140;
              auVar64._4_4_ = fVar126 * fVar142;
              auVar64._8_4_ = fVar129 * fVar143;
              auVar64._12_4_ = fVar132 * fVar144;
              auVar76._0_4_ = fVar145 * fVar119;
              auVar76._4_4_ = fVar148 * fVar127;
              auVar76._8_4_ = fVar149 * fVar130;
              auVar76._12_4_ = fVar150 * fVar133;
              auVar69 = vsubps_avx(auVar76,auVar64);
              auVar114._8_4_ = 0x7fffffff;
              auVar114._0_8_ = 0x7fffffff7fffffff;
              auVar114._12_4_ = 0x7fffffff;
              auVar99 = vandps_avx(auVar42,auVar114);
              auVar49 = vandps_avx(auVar64,auVar114);
              auVar99 = vcmpps_avx(auVar99,auVar49,1);
              local_10e8 = vblendvps_avx(auVar69,auVar100,auVar99);
              auVar53._0_4_ = fVar152 * fVar119;
              auVar53._4_4_ = fVar157 * fVar127;
              auVar53._8_4_ = fVar159 * fVar130;
              auVar53._12_4_ = fVar161 * fVar133;
              auVar65._0_4_ = fVar152 * fVar68;
              auVar65._4_4_ = fVar157 * fVar80;
              auVar65._8_4_ = fVar159 * fVar47;
              auVar65._12_4_ = fVar161 * fVar48;
              auVar77._0_4_ = fVar151 * fVar118;
              auVar77._4_4_ = fVar156 * fVar126;
              auVar77._8_4_ = fVar158 * fVar129;
              auVar77._12_4_ = fVar160 * fVar132;
              auVar100 = vsubps_avx(auVar65,auVar77);
              auVar107._0_4_ = fVar118 * fVar91;
              auVar107._4_4_ = fVar126 * fVar87;
              auVar107._8_4_ = fVar129 * fVar88;
              auVar107._12_4_ = fVar132 * fVar89;
              auVar69 = vsubps_avx(auVar107,auVar53);
              auVar99 = vandps_avx(auVar77,auVar114);
              auVar49 = vandps_avx(auVar53,auVar114);
              auVar99 = vcmpps_avx(auVar99,auVar49,1);
              local_10d8 = vblendvps_avx(auVar69,auVar100,auVar99);
              auVar66._0_4_ = fVar145 * fVar91;
              auVar66._4_4_ = fVar148 * fVar87;
              auVar66._8_4_ = fVar149 * fVar88;
              auVar66._12_4_ = fVar150 * fVar89;
              auVar78._0_4_ = fVar151 * fVar145;
              auVar78._4_4_ = fVar156 * fVar148;
              auVar78._8_4_ = fVar158 * fVar149;
              auVar78._12_4_ = fVar160 * fVar150;
              auVar97._0_4_ = fVar162 * fVar152;
              auVar97._4_4_ = fVar164 * fVar157;
              auVar97._8_4_ = fVar165 * fVar159;
              auVar97._12_4_ = fVar166 * fVar161;
              auVar108._0_4_ = fVar152 * fVar140;
              auVar108._4_4_ = fVar157 * fVar142;
              auVar108._8_4_ = fVar159 * fVar143;
              auVar108._12_4_ = fVar161 * fVar144;
              auVar100 = vsubps_avx(auVar78,auVar97);
              auVar69 = vsubps_avx(auVar108,auVar66);
              auVar99 = vandps_avx(auVar97,auVar114);
              auVar49 = vandps_avx(auVar66,auVar114);
              auVar99 = vcmpps_avx(auVar99,auVar49,1);
              local_10c8 = vblendvps_avx(auVar69,auVar100,auVar99);
              fVar68 = local_10e8._0_4_ * fStack_1244 +
                       local_10d8._0_4_ * fVar82 + local_10c8._0_4_ * local_1258._4_4_;
              fVar87 = local_10e8._4_4_ * fStack_1244 +
                       local_10d8._4_4_ * fVar82 + local_10c8._4_4_ * local_1258._4_4_;
              fVar80 = local_10e8._8_4_ * fStack_1244 +
                       local_10d8._8_4_ * fVar82 + local_10c8._8_4_ * local_1258._4_4_;
              fVar82 = local_10e8._12_4_ * fStack_1244 +
                       local_10d8._12_4_ * fVar82 + local_10c8._12_4_ * local_1258._4_4_;
              auVar79._0_4_ = fVar68 + fVar68;
              auVar79._4_4_ = fVar87 + fVar87;
              auVar79._8_4_ = fVar80 + fVar80;
              auVar79._12_4_ = fVar82 + fVar82;
              fVar68 = local_10e8._0_4_ * fVar16 +
                       local_10d8._0_4_ * fVar14 + local_10c8._0_4_ * fVar15;
              fVar102 = local_10e8._4_4_ * fVar106 +
                        local_10d8._4_4_ * fVar102 + local_10c8._4_4_ * fVar104;
              fVar104 = local_10e8._8_4_ * fVar19 +
                        local_10d8._8_4_ * fVar17 + local_10c8._8_4_ * fVar18;
              fVar106 = local_10e8._12_4_ * fVar22 +
                        local_10d8._12_4_ * fVar20 + local_10c8._12_4_ * fVar21;
              auVar99 = vrcpps_avx(auVar79);
              fVar82 = auVar99._0_4_;
              auVar115._0_4_ = auVar79._0_4_ * fVar82;
              fVar14 = auVar99._4_4_;
              auVar115._4_4_ = auVar79._4_4_ * fVar14;
              fVar15 = auVar99._8_4_;
              auVar115._8_4_ = auVar79._8_4_ * fVar15;
              fVar16 = auVar99._12_4_;
              auVar115._12_4_ = auVar79._12_4_ * fVar16;
              auVar123._8_4_ = 0x3f800000;
              auVar123._0_8_ = &DAT_3f8000003f800000;
              auVar123._12_4_ = 0x3f800000;
              auVar99 = vsubps_avx(auVar123,auVar115);
              local_1278._0_4_ = (fVar68 + fVar68) * (fVar82 + fVar82 * auVar99._0_4_);
              local_1278._4_4_ = (fVar102 + fVar102) * (fVar14 + fVar14 * auVar99._4_4_);
              local_1278._8_4_ = (fVar104 + fVar104) * (fVar15 + fVar15 * auVar99._8_4_);
              local_1278._12_4_ = (fVar106 + fVar106) * (fVar16 + fVar16 * auVar99._12_4_);
              uVar35 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar98._4_4_ = uVar35;
              auVar98._0_4_ = uVar35;
              auVar98._8_4_ = uVar35;
              auVar98._12_4_ = uVar35;
              auVar99 = vcmpps_avx(auVar98,local_1278,2);
              fVar82 = (ray->super_RayK<1>).tfar;
              auVar109._4_4_ = fVar82;
              auVar109._0_4_ = fVar82;
              auVar109._8_4_ = fVar82;
              auVar109._12_4_ = fVar82;
              auVar49 = vcmpps_avx(local_1278,auVar109,2);
              auVar99 = vandps_avx(auVar99,auVar49);
              auVar49 = vcmpps_avx(auVar79,_DAT_01feba10,4);
              auVar99 = vandps_avx(auVar49,auVar99);
              auVar24._8_8_ = uStack_1180;
              auVar24._0_8_ = local_1188;
              auVar49 = vandps_avx(local_1028,auVar24);
              auVar99 = vpslld_avx(auVar99,0x1f);
              auVar100 = vpsrad_avx(auVar99,0x1f);
              auVar99 = auVar49 & auVar100;
              if ((((auVar99 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar99 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar99 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar99[0xf] < '\0') {
                auVar99 = vandps_avx(auVar100,auVar49);
                local_1168 = local_1018;
                local_1128 = auVar99;
                local_10f8 = local_1278;
                local_1238 = auVar99;
                auVar49 = vrcpps_avx(local_1148);
                fVar82 = auVar49._0_4_;
                auVar54._0_4_ = local_1148._0_4_ * fVar82;
                fVar14 = auVar49._4_4_;
                auVar54._4_4_ = local_1148._4_4_ * fVar14;
                fVar15 = auVar49._8_4_;
                auVar54._8_4_ = local_1148._8_4_ * fVar15;
                fVar16 = auVar49._12_4_;
                auVar54._12_4_ = local_1148._12_4_ * fVar16;
                auVar67._8_4_ = 0x3f800000;
                auVar67._0_8_ = &DAT_3f8000003f800000;
                auVar67._12_4_ = 0x3f800000;
                auVar49 = vsubps_avx(auVar67,auVar54);
                auVar43._0_4_ = fVar82 + fVar82 * auVar49._0_4_;
                auVar43._4_4_ = fVar14 + fVar14 * auVar49._4_4_;
                auVar43._8_4_ = fVar15 + fVar15 * auVar49._8_4_;
                auVar43._12_4_ = fVar16 + fVar16 * auVar49._12_4_;
                auVar55._8_4_ = 0x219392ef;
                auVar55._0_8_ = 0x219392ef219392ef;
                auVar55._12_4_ = 0x219392ef;
                auVar83 = vcmpps_avx(auVar83,auVar55,5);
                auVar83 = vandps_avx(auVar83,auVar43);
                auVar56._0_4_ = local_1018._0_4_ * auVar83._0_4_;
                auVar56._4_4_ = local_1018._4_4_ * auVar83._4_4_;
                auVar56._8_4_ = local_1018._8_4_ * auVar83._8_4_;
                auVar56._12_4_ = local_1018._12_4_ * auVar83._12_4_;
                local_1118 = vminps_avx(auVar56,auVar67);
                auVar44._0_4_ = local_1158._0_4_ * auVar83._0_4_;
                auVar44._4_4_ = local_1158._4_4_ * auVar83._4_4_;
                auVar44._8_4_ = local_1158._8_4_ * auVar83._8_4_;
                auVar44._12_4_ = local_1158._12_4_ * auVar83._12_4_;
                local_1108 = vminps_avx(auVar44,auVar67);
                auVar45._8_4_ = 0x7f800000;
                auVar45._0_8_ = 0x7f8000007f800000;
                auVar45._12_4_ = 0x7f800000;
                auVar83 = vblendvps_avx(auVar45,local_1278,auVar99);
                auVar49 = vshufps_avx(auVar83,auVar83,0xb1);
                auVar49 = vminps_avx(auVar49,auVar83);
                auVar100 = vshufpd_avx(auVar49,auVar49,1);
                auVar49 = vminps_avx(auVar100,auVar49);
                auVar83 = vcmpps_avx(auVar83,auVar49,0);
                auVar49 = auVar99 & auVar83;
                if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar49[0xf] < '\0') {
                  auVar99 = vandps_avx(auVar83,auVar99);
                }
                uVar35 = vmovmskps_avx(auVar99);
                uVar28 = CONCAT44((int)((ulong)lVar27 >> 0x20),uVar35);
                piVar29 = (int *)0x0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> (long)piVar29 & 1) == 0; piVar29 = (int *)((long)piVar29 + 1)) {
                  }
                }
                do {
                  uVar4 = *(uint *)((long)&local_f88 + (long)piVar29 * 4);
                  pGVar11 = (pSVar34->geometries).items[uVar4].ptr;
                  if ((pGVar11->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1238 + (long)piVar29 * 4) = 0;
                  }
                  else {
                    pRVar12 = context->args;
                    if ((pRVar12->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar82 = *(float *)(local_1118 + (long)piVar29 * 4);
                      fVar14 = *(float *)(local_1108 + (long)piVar29 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_10f8 + (long)piVar29 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_10e8 + (long)piVar29 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_10d8 + (long)piVar29 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_10c8 + (long)piVar29 * 4);
                      ray->u = fVar82;
                      ray->v = fVar14;
                      ray->primID = *(uint *)((long)&local_1178 + (long)piVar29 * 4);
                      ray->geomID = uVar4;
                      pRVar13 = context->user;
                      ray->instID[0] = pRVar13->instID[0];
                      ray->instPrimID[0] = pRVar13->instPrimID[0];
                      unaff_R12 = local_1228;
                      break;
                    }
                    local_1220.context = context->user;
                    local_11c8 = *(float *)(local_10e8 + (long)piVar29 * 4);
                    local_11c4 = *(undefined4 *)(local_10d8 + (long)piVar29 * 4);
                    local_11c0 = *(undefined4 *)(local_10c8 + (long)piVar29 * 4);
                    local_11bc = *(undefined4 *)(local_1118 + (long)piVar29 * 4);
                    local_11b8 = *(undefined4 *)(local_1108 + (long)piVar29 * 4);
                    local_11b4 = *(undefined4 *)((long)&local_1178 + (long)piVar29 * 4);
                    local_11b0 = uVar4;
                    local_11ac = (local_1220.context)->instID[0];
                    local_11a8 = (local_1220.context)->instPrimID[0];
                    local_1248 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_10f8 + (long)piVar29 * 4);
                    local_125c = -1;
                    local_1220.valid = &local_125c;
                    local_1220.geometryUserPtr = pGVar11->userPtr;
                    local_1220.ray = (RTCRayN *)ray;
                    local_1220.hit = (RTCHitN *)&local_11c8;
                    local_1220.N = 1;
                    if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_012b0941:
                      if (pRVar12->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar12->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar12->filter)(&local_1220);
                          uVar33 = local_1290;
                          context = local_1268;
                        }
                        if (*local_1220.valid == 0) goto LAB_012b0a29;
                      }
                      (((Vec3f *)((long)local_1220.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1220.hit;
                      (((Vec3f *)((long)local_1220.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1220.hit + 4);
                      (((Vec3f *)((long)local_1220.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1220.hit + 8);
                      *(float *)((long)local_1220.ray + 0x3c) = *(float *)(local_1220.hit + 0xc);
                      *(float *)((long)local_1220.ray + 0x40) = *(float *)(local_1220.hit + 0x10);
                      *(float *)((long)local_1220.ray + 0x44) = *(float *)(local_1220.hit + 0x14);
                      *(float *)((long)local_1220.ray + 0x48) = *(float *)(local_1220.hit + 0x18);
                      *(float *)((long)local_1220.ray + 0x4c) = *(float *)(local_1220.hit + 0x1c);
                      *(float *)((long)local_1220.ray + 0x50) = *(float *)(local_1220.hit + 0x20);
                    }
                    else {
                      local_1258 = pSVar34;
                      (*pGVar11->intersectionFilterN)(&local_1220);
                      uVar33 = local_1290;
                      context = local_1268;
                      pSVar34 = local_1258;
                      if (*local_1220.valid != 0) goto LAB_012b0941;
LAB_012b0a29:
                      (ray->super_RayK<1>).tfar = local_1248;
                    }
                    *(undefined4 *)(local_1238 + (long)piVar29 * 4) = 0;
                    fVar82 = (ray->super_RayK<1>).tfar;
                    auVar57._4_4_ = fVar82;
                    auVar57._0_4_ = fVar82;
                    auVar57._8_4_ = fVar82;
                    auVar57._12_4_ = fVar82;
                    auVar83 = vcmpps_avx(local_1278,auVar57,2);
                    local_1238 = vandps_avx(auVar83,local_1238);
                    unaff_R12 = local_1228;
                  }
                  if ((((local_1238 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_1238 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_1238 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_1238[0xf]) break;
                  BVHNIntersector1<4,1,true,embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,true>>>
                  ::intersect(&local_1220);
                  piVar29 = local_1220.valid;
                  uVar33 = local_1290;
                  context = local_1268;
                } while( true );
              }
            }
            lVar39 = lVar39 + 1;
          } while (lVar39 != local_11d8);
        }
        fVar82 = (ray->super_RayK<1>).tfar;
        auVar46 = ZEXT1664(CONCAT412(fVar82,CONCAT48(fVar82,CONCAT44(fVar82,fVar82))));
        auVar116 = ZEXT1664(local_1038);
        auVar124 = ZEXT1664(local_1048);
        auVar137 = ZEXT1664(local_1058);
        auVar138 = ZEXT1664(local_1068);
        auVar139 = ZEXT1664(local_1078);
        auVar141 = ZEXT1664(local_1088);
        auVar147 = ZEXT1664(local_1098);
        auVar155 = ZEXT1664(local_10a8);
        auVar163 = ZEXT1664(local_10b8);
        auVar110 = ZEXT1664(local_1198);
        uVar28 = local_11e8;
        uVar30 = local_1280;
        uVar31 = local_1288;
        uVar38 = local_11f0;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }